

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogToFile(int auto_open_depth,char *filename)

{
  ImGuiContext *pIVar1;
  FILE *pFVar2;
  
  pIVar1 = GImGui;
  if ((GImGui->LogEnabled == false) &&
     (((filename != (char *)0x0 || (filename = (GImGui->IO).LogFilename, filename != (char *)0x0))
      && (*filename != '\0')))) {
    pFVar2 = fopen(filename,"ab");
    if (pFVar2 == (FILE *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x2bd6,"void ImGui::LogToFile(int, const char *)");
    }
    LogBegin(ImGuiLogType_File,auto_open_depth);
    pIVar1->LogFile = (ImFileHandle)pFVar2;
  }
  return;
}

Assistant:

void ImGui::LogToFile(int auto_open_depth, const char* filename)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;

    // FIXME: We could probably open the file in text mode "at", however note that clipboard/buffer logging will still
    // be subject to outputting OS-incompatible carriage return if within strings the user doesn't use IM_NEWLINE.
    // By opening the file in binary mode "ab" we have consistent output everywhere.
    if (!filename)
        filename = g.IO.LogFilename;
    if (!filename || !filename[0])
        return;
    ImFileHandle f = ImFileOpen(filename, "ab");
    if (!f)
    {
        IM_ASSERT(0);
        return;
    }

    LogBegin(ImGuiLogType_File, auto_open_depth);
    g.LogFile = f;
}